

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

bool ul_is_an_mca_channel(UL *ul)

{
  UL *this;
  bool bVar1;
  byte_t *pbVar2;
  Dictionary *this_00;
  UL local_38;
  UL *local_18;
  UL *ul_local;
  
  local_18 = ul;
  pbVar2 = Kumu::Identifier<16U>::Value(&ul->super_Identifier<16U>);
  this = local_18;
  if (pbVar2[10] == '\x01') {
    ul_local._7_1_ = true;
  }
  else {
    this_00 = ASDCP::DefaultSMPTEDict();
    pbVar2 = ASDCP::Dictionary::ul(this_00,MDD_AudioChannelSLVS);
    ASDCP::UL::UL(&local_38,pbVar2);
    bVar1 = ASDCP::UL::operator==(this,&local_38);
    ASDCP::UL::~UL(&local_38);
    if (bVar1) {
      ul_local._7_1_ = true;
    }
    else {
      ul_local._7_1_ = false;
    }
  }
  return ul_local._7_1_;
}

Assistant:

static bool
ul_is_an_mca_channel(const ASDCP::UL& ul)
{
  if ( ul.Value()[10] == 1 ) // magic depends on UL "Essence Facet" byte (see ST 428-12)
    {
      return true;
    }

  if ( ul == ASDCP::DefaultSMPTEDict().ul(ASDCP::MDD_AudioChannelSLVS) ) // not all ULs obey ST 428-12!
    {
      return true;
    }

  return false;
}